

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall cfd::core::Pubkey::Uncompress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  uchar *pub_key;
  size_type pub_key_len;
  uchar *bytes_out;
  size_type len;
  CfdException *this_00;
  ByteData local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0;
  CfdSourceLocation local_80;
  int local_64;
  undefined1 local_60 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompress_data;
  Pubkey *this_local;
  
  decompress_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = IsCompress(this);
  if (bVar1) {
    ::std::allocator<unsigned_char>::allocator(&local_31);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x41,&local_31);
    ::std::allocator<unsigned_char>::~allocator(&local_31);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                       &this->data_);
    pub_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    pub_key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    local_64 = wally_ec_public_key_decompress(pub_key,pub_key_len,bytes_out,len);
    if (local_64 != 0) {
      local_80.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
                   ,0x2f);
      local_80.filename = local_80.filename + 1;
      local_80.line = 0x96;
      local_80.funcname = "Uncompress";
      logger::warn<int&>(&local_80,"wally_ec_public_key_decompress error. ret={}",&local_64);
      local_a2 = 1;
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a0,"Failed to uncompress pubkey.",&local_a1);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_a0);
      local_a2 = 0;
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(&local_c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    Pubkey(__return_storage_ptr__,&local_c0);
    ByteData::~ByteData(&local_c0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  }
  else {
    Pubkey(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Uncompress() const {
  if (!IsCompress()) {
    return *this;
  }

  // The conversion from uncompress to compress is irreversible.
  // (if convert compress to uncompress, prefix is '04'. Not '06' or '07'.)
  std::vector<uint8_t> decompress_data(EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
  std::vector<uint8_t> data = data_.GetBytes();
  int ret = wally_ec_public_key_decompress(
      data.data(), data.size(), decompress_data.data(),
      decompress_data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_public_key_decompress error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to uncompress pubkey.");
  }
  return Pubkey(decompress_data);
}